

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_font.cpp
# Opt level: O2

void Timidity::font_remove(char *filename)

{
  FontFile *pFVar1;
  undefined8 extraout_RDX;
  
  pFVar1 = font_find(filename);
  if (pFVar1 != (FontFile *)0x0) {
    (*pFVar1->_vptr_FontFile[5])(pFVar1,0xff,extraout_RDX,pFVar1->_vptr_FontFile[5]);
    return;
  }
  return;
}

Assistant:

void font_remove(const char *filename)
{
	FontFile *font;

	font = font_find(filename);
	if (font != NULL)
	{
		// Don't actually remove the font from the list, because instruments
		// from it might be loaded using the %font extension.
		font->SetAllOrders(255);
	}
}